

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Flow3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  uint fVerbose;
  int iVar6;
  uint fUseMfs;
  uint fUseLutLib;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  fUseMfs = 1;
  local_44 = 8;
  local_48 = 6;
  local_40 = 0;
  fUseLutLib = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"KCbtmlvh"), iVar6 = globalUtilOptind, iVar1 == 0x76
            ) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 < 0x62) break;
      if (iVar1 < 0x6d) {
        if (iVar1 == 0x62) {
          local_3c = local_3c ^ 1;
        }
        else {
          if (iVar1 != 0x6c) goto LAB_00281892;
          fUseLutLib = fUseLutLib ^ 1;
        }
      }
      else if (iVar1 == 0x6d) {
        fUseMfs = fUseMfs ^ 1;
      }
      else {
        if (iVar1 != 0x74) goto LAB_00281892;
        local_40 = local_40 ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar4 = "Abc_CommandAbc9Flow3(): There is no AIG.\n";
      }
      else {
        if ((fUseLutLib == 0) || (pvVar3 = Abc_FrameReadLibLut(), pvVar3 != (void *)0x0)) {
          Gia_ManPerformFlow3(local_48,local_44,local_3c,local_40,fUseMfs,fUseLutLib,fVerbose);
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Flow3(): Please enter LUT library using \'read_lut\'.\n";
      }
      iVar6 = -1;
      goto LAB_00281994;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_00281886;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    else {
      if (iVar1 != 0x4b) goto LAB_00281892;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_00281886:
        Abc_Print(-1,pcVar4);
        goto LAB_00281892;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar2 < 0) {
LAB_00281892:
      Abc_Print(-2,"usage: &flow3 [-KC num] [-btmlvh]\n");
      Abc_Print(-2,"\t         integration optimization and mapping flow\n");
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",(ulong)local_48
               );
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)local_44);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_3c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle using SOP balancing during synthesis [default = %s]\n",pcVar4)
      ;
      pcVar4 = "yes";
      if (local_40 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle minimizing average (not maximum) level [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (fUseMfs == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fUseLutLib == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle using previously entered LUT library [default = %s]\n",pcVar4)
      ;
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_00281994:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Flow3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManPerformFlow3( int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fUseLutLib, int fVerbose );
    int nLutSize    =  6;
    int nCutNum     =  8;
    int fBalance    =  0;
    int fMinAve     =  0;
    int fUseMfs     =  1;
    int fUseLutLib  =  0;
    int c, fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCbtmlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'b':
            fBalance ^= 1;
            break;
        case 't':
            fMinAve ^= 1;
            break;
        case 'm':
            fUseMfs ^= 1;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow3(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseLutLib && Abc_FrameReadLibLut() == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow3(): Please enter LUT library using \'read_lut\'.\n" );
        return 1;
    }
    Gia_ManPerformFlow3( nLutSize, nCutNum, fBalance, fMinAve, fUseMfs, fUseLutLib, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &flow3 [-KC num] [-btmlvh]\n" );
    Abc_Print( -2, "\t         integration optimization and mapping flow\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",           nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n",                  nCutNum );
    Abc_Print( -2, "\t-b     : toggle using SOP balancing during synthesis [default = %s]\n",   fBalance? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle minimizing average (not maximum) level [default = %s]\n", fMinAve? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",           fUseMfs? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle using previously entered LUT library [default = %s]\n",   fUseLutLib? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",           fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}